

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int allocateBtreePage(BtShared *pBt,MemPage **ppPage,Pgno *pPgno,Pgno nearby,u8 eMode)

{
  u8 uVar1;
  byte bVar2;
  uint uVar3;
  uint uVar4;
  Pgno pgno;
  Bitvec *p;
  MemPage *pMVar5;
  bool bVar6;
  bool bVar7;
  MemPage **ppMVar8;
  MemPage *pMVar9;
  int iVar10;
  uint uVar11;
  byte *pbVar12;
  u8 *puVar13;
  int iVar14;
  ulong uVar15;
  undefined8 uVar16;
  uint uVar17;
  int iVar18;
  undefined7 in_register_00000081;
  bool bVar19;
  BtShared *pBVar20;
  uint uVar21;
  MemPage *pMVar22;
  MemPage *pTrunk;
  u8 eType;
  int local_94;
  MemPage *local_78;
  undefined4 local_6c;
  uint *local_68;
  uint local_60;
  uint local_5c;
  ulong local_58;
  MemPage **local_50;
  MemPage *local_48;
  MemPage *local_40;
  Pgno local_34;
  
  local_78 = (MemPage *)0x0;
  pMVar22 = pBt->pPage1;
  uVar3 = pBt->nPage;
  uVar17 = *(uint *)(pMVar22->aData + 0x24);
  uVar17 = uVar17 >> 0x18 | (uVar17 & 0xff0000) >> 8 | (uVar17 & 0xff00) << 8 | uVar17 << 0x18;
  local_68 = pPgno;
  if (uVar3 <= uVar17) {
    uVar16 = 0xd4f3;
    goto LAB_0013409e;
  }
  if (uVar17 == 0) {
    uVar1 = pBt->bDoTruncate;
    iVar10 = sqlite3PagerWrite(pMVar22->pDbPage);
    if (iVar10 == 0) {
      uVar3 = pBt->nPage;
      pBt->nPage = uVar3 + 1;
      uVar17 = (uint)sqlite3PendingByte / pBt->pageSize;
      if (uVar3 == uVar17) {
        pBt->nPage = uVar3 + 2;
      }
      uVar3 = (uint)(uVar1 == '\0');
      pBVar20 = pBt;
      if (pBt->autoVacuum == '\0') {
LAB_001347de:
        iVar14 = (int)pBVar20;
        uVar17 = pBt->nPage;
        *(uint *)(pBt->pPage1->aData + 0x1c) =
             uVar17 >> 0x18 | (uVar17 & 0xff0000) >> 8 | (uVar17 & 0xff00) << 8 | uVar17 << 0x18;
        pgno = pBt->nPage;
        *local_68 = pgno;
        iVar10 = btreeGetPage(pBt,pgno,ppPage,uVar3,0);
        if (iVar10 != 0) goto LAB_00134813;
        iVar10 = sqlite3PagerWrite((*ppPage)->pDbPage);
        bVar19 = true;
        if ((iVar10 != 0) && (*ppPage != (MemPage *)0x0)) {
          sqlite3PagerUnref((*ppPage)->pDbPage);
        }
      }
      else {
        uVar21 = pBt->nPage;
        uVar11 = 0;
        if (1 < uVar21) {
          iVar10 = (uVar21 - 2) - (uVar21 - 2) % (pBt->usableSize / 5 + 1);
          uVar11 = iVar10 + (uint)(iVar10 + 1U == uVar17) + 2;
        }
        if (uVar11 != uVar21) goto LAB_001347de;
        local_40 = (MemPage *)0x0;
        uVar17 = btreeGetPage(pBt,uVar21,&local_40,uVar3,0);
        pMVar22 = local_40;
        pBVar20 = (BtShared *)(ulong)uVar17;
        if (uVar17 == 0) {
          uVar17 = sqlite3PagerWrite(local_40->pDbPage);
          pBVar20 = (BtShared *)(ulong)uVar17;
          if (pMVar22 != (MemPage *)0x0) {
            sqlite3PagerUnref(pMVar22->pDbPage);
          }
        }
        iVar10 = (int)pBVar20;
        if (iVar10 == 0) {
          uVar17 = pBt->nPage;
          pBt->nPage = uVar17 + 1;
          if (uVar17 == (uint)sqlite3PendingByte / pBt->pageSize) {
            pBt->nPage = uVar17 + 2;
          }
          goto LAB_001347de;
        }
        bVar19 = false;
        iVar14 = iVar10;
      }
    }
    else {
LAB_00134813:
      bVar19 = false;
      iVar14 = iVar10;
    }
    if (!bVar19) {
      return iVar14;
    }
    pMVar22 = (MemPage *)0x0;
  }
  else {
    local_50 = ppPage;
    local_34 = nearby;
    if (eMode == '\x02') {
      bVar19 = true;
LAB_001340d9:
      iVar10 = sqlite3PagerWrite(pMVar22->pDbPage);
      if (iVar10 != 0) goto LAB_001340f1;
      uVar17 = uVar17 - 1;
      *(uint *)(pMVar22->aData + 0x24) =
           uVar17 >> 0x18 | (uVar17 & 0xff0000) >> 8 | (uVar17 & 0xff00) << 8 | uVar17 * 0x1000000;
      local_6c = (int)CONCAT71(in_register_00000081,eMode);
      local_48 = pMVar22;
      do {
        pMVar22 = local_78;
        if (local_78 == (MemPage *)0x0) {
          puVar13 = local_48->aData;
          uVar17 = (uint)puVar13[0x22] << 8 |
                   (uint)puVar13[0x21] << 0x10 | (uint)puVar13[0x20] << 0x18;
          pbVar12 = puVar13 + 0x23;
        }
        else {
          pbVar12 = local_78->aData;
          uVar17 = (uint)pbVar12[2] << 8 | (uint)pbVar12[1] << 0x10 | (uint)*pbVar12 << 0x18;
          pbVar12 = pbVar12 + 3;
        }
        uVar17 = *pbVar12 | uVar17;
        if (uVar3 < uVar17) {
          iVar10 = 0xb;
          sqlite3_log(0xb,"database corruption at line %d of [%.10s]",0xd524,
                      "118a3b35693b134d56ebd780123b7fd6f1497668");
        }
        else {
          iVar10 = btreeGetPage(pBt,uVar17,&local_78,0,0);
        }
        pMVar5 = local_78;
        if (iVar10 != 0) {
          local_78 = (MemPage *)0x0;
          goto LAB_0013489f;
        }
        puVar13 = local_78->aData;
        uVar21 = *(uint *)(puVar13 + 4);
        uVar21 = uVar21 >> 0x18 | (uVar21 & 0xff0000) >> 8 | (uVar21 & 0xff00) << 8 | uVar21 << 0x18
        ;
        if ((bVar19) || (uVar21 != 0)) {
          if ((pBt->usableSize >> 2) - 2 < uVar21) {
            iVar10 = 0xb;
            sqlite3_log(0xb,"database corruption at line %d of [%.10s]",0xd540,
                        "118a3b35693b134d56ebd780123b7fd6f1497668");
LAB_0013495d:
            bVar19 = false;
            goto LAB_001348a4;
          }
          if (bVar19) {
            if ((uVar17 == local_34) || ((char)local_6c == '\x02' && uVar17 < local_34)) {
              *local_68 = uVar17;
              *local_50 = local_78;
              iVar10 = sqlite3PagerWrite(local_78->pDbPage);
              bVar19 = false;
              if (iVar10 != 0) goto LAB_0013495d;
              if (uVar21 == 0) {
                if (pMVar22 == (MemPage *)0x0) {
                  puVar13 = local_48->aData + 0x20;
                }
                else {
                  iVar10 = sqlite3PagerWrite(pMVar22->pDbPage);
                  if (iVar10 != 0) goto LAB_001348a4;
                  puVar13 = pMVar22->aData;
                }
                *(undefined4 *)puVar13 = *(undefined4 *)pMVar5->aData;
                iVar10 = 0;
              }
              else {
                puVar13 = pMVar5->aData;
                bVar2 = puVar13[0xb];
                uVar17 = (uint)puVar13[10] << 8 |
                         (uint)puVar13[9] << 0x10 | (uint)puVar13[8] << 0x18 | (uint)bVar2;
                if (uVar3 < uVar17) {
                  iVar10 = 0xb;
                  sqlite3_log(0xb,"database corruption at line %d of [%.10s]",0xd562,
                              "118a3b35693b134d56ebd780123b7fd6f1497668");
LAB_00134411:
                  bVar6 = false;
                }
                else {
                  local_58 = CONCAT44(local_58._4_4_,(uint)puVar13[8]);
                  local_60 = (uint)puVar13[10];
                  local_5c = (uint)puVar13[9];
                  iVar10 = btreeGetPage(pBt,uVar17,&local_40,0,0);
                  pMVar9 = local_40;
                  if (iVar10 != 0) goto LAB_00134411;
                  iVar10 = sqlite3PagerWrite(local_40->pDbPage);
                  if (iVar10 != 0) {
                    if (pMVar9 != (MemPage *)0x0) {
                      sqlite3PagerUnref(pMVar9->pDbPage);
                    }
                    goto LAB_00134411;
                  }
                  *(undefined4 *)pMVar9->aData = *(undefined4 *)pMVar5->aData;
                  uVar17 = uVar21 - 1;
                  *(uint *)(pMVar9->aData + 4) =
                       uVar17 >> 0x18 | (uVar17 & 0xff0000) >> 8 | (uVar17 & 0xff00) << 8 |
                       uVar17 * 0x1000000;
                  memcpy(pMVar9->aData + 8,pMVar5->aData + 0xc,(ulong)(uVar21 * 4 - 4));
                  if (pMVar9 != (MemPage *)0x0) {
                    sqlite3PagerUnref(pMVar9->pDbPage);
                  }
                  if (pMVar22 == (MemPage *)0x0) {
                    puVar13 = local_48->aData;
                    puVar13[0x20] = (u8)local_58;
                    puVar13[0x21] = (u8)local_5c;
                    puVar13[0x22] = (u8)local_60;
                    puVar13[0x23] = bVar2;
                    bVar6 = true;
                    iVar10 = 0;
                  }
                  else {
                    iVar14 = sqlite3PagerWrite(pMVar22->pDbPage);
                    iVar10 = 0;
                    if (iVar14 == 0) {
                      puVar13 = pMVar22->aData;
                      *puVar13 = (u8)local_58;
                      puVar13[1] = (u8)local_5c;
                      puVar13[2] = (u8)local_60;
                      puVar13[3] = bVar2;
                      bVar6 = true;
                    }
                    else {
                      bVar6 = false;
                      iVar10 = iVar14;
                    }
                  }
                }
                bVar19 = false;
                if (!bVar6) goto LAB_001348a4;
              }
              local_78 = (MemPage *)0x0;
              bVar6 = false;
              goto LAB_001344e5;
            }
          }
          if (uVar21 == 0) {
            iVar10 = 0;
            bVar6 = bVar19;
          }
          else {
            uVar17 = 0;
            if (local_34 != 0) {
              if ((char)local_6c == '\x02') {
                uVar11 = 8;
                uVar15 = 0;
                do {
                  uVar4 = *(uint *)(puVar13 + uVar11);
                  if ((uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 |
                      uVar4 << 0x18) <= local_34) {
                    uVar17 = (uint)uVar15;
                    break;
                  }
                  uVar15 = uVar15 + 1;
                  uVar11 = uVar11 + 4;
                } while (uVar21 != uVar15);
              }
              else {
                uVar17 = 0;
                if (uVar21 != 1) {
                  uVar17 = *(uint *)(puVar13 + 8);
                  iVar14 = (uVar17 >> 0x18 | (uVar17 & 0xff0000) >> 8 | (uVar17 & 0xff00) << 8 |
                           uVar17 << 0x18) - local_34;
                  iVar10 = -iVar14;
                  if (-1 < iVar14) {
                    iVar10 = iVar14;
                  }
                  uVar17 = 0;
                  uVar15 = 1;
                  uVar11 = 0xc;
                  do {
                    uVar4 = *(uint *)(puVar13 + uVar11);
                    iVar18 = (uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 |
                             uVar4 << 0x18) - local_34;
                    iVar14 = -iVar18;
                    if (-1 < iVar18) {
                      iVar14 = iVar18;
                    }
                    if (iVar14 < iVar10) {
                      uVar17 = (uint)uVar15;
                      iVar10 = iVar14;
                    }
                    uVar15 = uVar15 + 1;
                    uVar11 = uVar11 + 4;
                  } while (uVar21 != uVar15);
                }
              }
            }
            uVar15 = (ulong)(uVar17 * 4 + 8);
            uVar11 = *(uint *)(puVar13 + uVar15);
            uVar11 = uVar11 >> 0x18 | (uVar11 & 0xff0000) >> 8 | (uVar11 & 0xff00) << 8 |
                     uVar11 << 0x18;
            if (uVar3 < uVar11) {
              iVar10 = 0xb;
              sqlite3_log(0xb,"database corruption at line %d of [%.10s]",0xd5a3,
                          "118a3b35693b134d56ebd780123b7fd6f1497668");
LAB_001344b4:
              bVar7 = false;
            }
            else {
              if (((uVar11 == local_34) || ((char)local_6c == '\x02' && uVar11 < local_34)) ||
                 (!bVar19)) {
                *local_68 = uVar11;
                local_58 = uVar15;
                iVar10 = sqlite3PagerWrite(local_78->pDbPage);
                if (iVar10 != 0) goto LAB_001344b4;
                uVar11 = uVar21 - 1;
                if (uVar17 < uVar11) {
                  *(undefined4 *)(puVar13 + local_58) = *(undefined4 *)(puVar13 + (uVar21 * 4 + 4));
                }
                *(uint *)(puVar13 + 4) =
                     uVar11 >> 0x18 | (uVar11 & 0xff0000) >> 8 | (uVar11 & 0xff00) << 8 |
                     uVar11 * 0x1000000;
                uVar17 = *local_68;
                p = pBt->pHasContent;
                if (p == (Bitvec *)0x0) {
                  uVar21 = 1;
                }
                else {
                  uVar21 = 0;
                  if (uVar17 <= p->iSize) {
                    iVar10 = sqlite3BitvecTest(p,uVar17);
                    uVar21 = (uint)(iVar10 == 0);
                  }
                }
                ppMVar8 = local_50;
                iVar10 = btreeGetPage(pBt,uVar17,local_50,uVar21,0);
                if (iVar10 == 0) {
                  iVar10 = sqlite3PagerWrite((*ppMVar8)->pDbPage);
                  if (iVar10 == 0) {
                    bVar19 = false;
                    iVar10 = 0;
                  }
                  else {
                    pMVar5 = *ppMVar8;
                    if (pMVar5 != (MemPage *)0x0) {
                      sqlite3PagerUnref(pMVar5->pDbPage);
                    }
                    bVar19 = false;
                  }
                }
                else {
                  bVar19 = false;
                }
              }
              else {
                bVar19 = true;
                iVar10 = 0;
              }
              bVar7 = true;
            }
            bVar6 = bVar19;
            if (!bVar7) goto LAB_0013489f;
          }
        }
        else {
          iVar10 = sqlite3PagerWrite(local_78->pDbPage);
          if (iVar10 != 0) goto LAB_0013489f;
          *local_68 = uVar17;
          *(undefined4 *)(local_48->aData + 0x20) = *(undefined4 *)pMVar5->aData;
          *local_50 = pMVar5;
          local_78 = (MemPage *)0x0;
          iVar10 = 0;
          bVar6 = false;
        }
LAB_001344e5:
        if (pMVar22 != (MemPage *)0x0) {
          sqlite3PagerUnref(pMVar22->pDbPage);
        }
        bVar19 = true;
      } while (bVar6);
      pMVar22 = (MemPage *)0x0;
LAB_0013489f:
      bVar19 = false;
    }
    else {
      if ((eMode != '\x01') || (uVar3 < nearby)) {
        bVar19 = false;
        goto LAB_001340d9;
      }
      iVar10 = ptrmapGet(pBt,nearby,(u8 *)&local_40,(Pgno *)0x0);
      if (iVar10 == 0) {
        bVar19 = iVar10 == 0 && (char)local_40 == '\x02';
        local_94 = iVar10;
        goto LAB_001340d9;
      }
LAB_001340f1:
      pMVar22 = (MemPage *)0x0;
      bVar19 = true;
      local_94 = iVar10;
    }
LAB_001348a4:
    ppPage = local_50;
    if (bVar19) {
      return local_94;
    }
  }
  if (local_78 != (MemPage *)0x0) {
    sqlite3PagerUnref(local_78->pDbPage);
  }
  if (pMVar22 != (MemPage *)0x0) {
    sqlite3PagerUnref(pMVar22->pDbPage);
  }
  if (iVar10 != 0) {
    *ppPage = (MemPage *)0x0;
    return iVar10;
  }
  pMVar22 = *ppPage;
  if (pMVar22->pDbPage->nRef < 2) {
    pMVar22->isInit = '\0';
    return 0;
  }
  if (pMVar22 != (MemPage *)0x0) {
    sqlite3PagerUnref(pMVar22->pDbPage);
  }
  uVar16 = 0xd605;
LAB_0013409e:
  sqlite3_log(0xb,"database corruption at line %d of [%.10s]",uVar16,
              "118a3b35693b134d56ebd780123b7fd6f1497668");
  return 0xb;
}

Assistant:

static int allocateBtreePage(
  BtShared *pBt,         /* The btree */
  MemPage **ppPage,      /* Store pointer to the allocated page here */
  Pgno *pPgno,           /* Store the page number here */
  Pgno nearby,           /* Search for a page near this one */
  u8 eMode               /* BTALLOC_EXACT, BTALLOC_LT, or BTALLOC_ANY */
){
  MemPage *pPage1;
  int rc;
  u32 n;     /* Number of pages on the freelist */
  u32 k;     /* Number of leaves on the trunk of the freelist */
  MemPage *pTrunk = 0;
  MemPage *pPrevTrunk = 0;
  Pgno mxPage;     /* Total size of the database file */

  assert( sqlite3_mutex_held(pBt->mutex) );
  assert( eMode==BTALLOC_ANY || (nearby>0 && IfNotOmitAV(pBt->autoVacuum)) );
  pPage1 = pBt->pPage1;
  mxPage = btreePagecount(pBt);
  n = get4byte(&pPage1->aData[36]);
  testcase( n==mxPage-1 );
  if( n>=mxPage ){
    return SQLITE_CORRUPT_BKPT;
  }
  if( n>0 ){
    /* There are pages on the freelist.  Reuse one of those pages. */
    Pgno iTrunk;
    u8 searchList = 0; /* If the free-list must be searched for 'nearby' */
    
    /* If eMode==BTALLOC_EXACT and a query of the pointer-map
    ** shows that the page 'nearby' is somewhere on the free-list, then
    ** the entire-list will be searched for that page.
    */
#ifndef SQLITE_OMIT_AUTOVACUUM
    if( eMode==BTALLOC_EXACT ){
      if( nearby<=mxPage ){
        u8 eType;
        assert( nearby>0 );
        assert( pBt->autoVacuum );
        rc = ptrmapGet(pBt, nearby, &eType, 0);
        if( rc ) return rc;
        if( eType==PTRMAP_FREEPAGE ){
          searchList = 1;
        }
      }
    }else if( eMode==BTALLOC_LE ){
      searchList = 1;
    }
#endif

    /* Decrement the free-list count by 1. Set iTrunk to the index of the
    ** first free-list trunk page. iPrevTrunk is initially 1.
    */
    rc = sqlite3PagerWrite(pPage1->pDbPage);
    if( rc ) return rc;
    put4byte(&pPage1->aData[36], n-1);

    /* The code within this loop is run only once if the 'searchList' variable
    ** is not true. Otherwise, it runs once for each trunk-page on the
    ** free-list until the page 'nearby' is located (eMode==BTALLOC_EXACT)
    ** or until a page less than 'nearby' is located (eMode==BTALLOC_LT)
    */
    do {
      pPrevTrunk = pTrunk;
      if( pPrevTrunk ){
        iTrunk = get4byte(&pPrevTrunk->aData[0]);
      }else{
        iTrunk = get4byte(&pPage1->aData[32]);
      }
      testcase( iTrunk==mxPage );
      if( iTrunk>mxPage ){
        rc = SQLITE_CORRUPT_BKPT;
      }else{
        rc = btreeGetPage(pBt, iTrunk, &pTrunk, 0, 0);
      }
      if( rc ){
        pTrunk = 0;
        goto end_allocate_page;
      }
      assert( pTrunk!=0 );
      assert( pTrunk->aData!=0 );

      k = get4byte(&pTrunk->aData[4]); /* # of leaves on this trunk page */
      if( k==0 && !searchList ){
        /* The trunk has no leaves and the list is not being searched. 
        ** So extract the trunk page itself and use it as the newly 
        ** allocated page */
        assert( pPrevTrunk==0 );
        rc = sqlite3PagerWrite(pTrunk->pDbPage);
        if( rc ){
          goto end_allocate_page;
        }
        *pPgno = iTrunk;
        memcpy(&pPage1->aData[32], &pTrunk->aData[0], 4);
        *ppPage = pTrunk;
        pTrunk = 0;
        TRACE(("ALLOCATE: %d trunk - %d free pages left\n", *pPgno, n-1));
      }else if( k>(u32)(pBt->usableSize/4 - 2) ){
        /* Value of k is out of range.  Database corruption */
        rc = SQLITE_CORRUPT_BKPT;
        goto end_allocate_page;
#ifndef SQLITE_OMIT_AUTOVACUUM
      }else if( searchList 
            && (nearby==iTrunk || (iTrunk<nearby && eMode==BTALLOC_LE)) 
      ){
        /* The list is being searched and this trunk page is the page
        ** to allocate, regardless of whether it has leaves.
        */
        *pPgno = iTrunk;
        *ppPage = pTrunk;
        searchList = 0;
        rc = sqlite3PagerWrite(pTrunk->pDbPage);
        if( rc ){
          goto end_allocate_page;
        }
        if( k==0 ){
          if( !pPrevTrunk ){
            memcpy(&pPage1->aData[32], &pTrunk->aData[0], 4);
          }else{
            rc = sqlite3PagerWrite(pPrevTrunk->pDbPage);
            if( rc!=SQLITE_OK ){
              goto end_allocate_page;
            }
            memcpy(&pPrevTrunk->aData[0], &pTrunk->aData[0], 4);
          }
        }else{
          /* The trunk page is required by the caller but it contains 
          ** pointers to free-list leaves. The first leaf becomes a trunk
          ** page in this case.
          */
          MemPage *pNewTrunk;
          Pgno iNewTrunk = get4byte(&pTrunk->aData[8]);
          if( iNewTrunk>mxPage ){ 
            rc = SQLITE_CORRUPT_BKPT;
            goto end_allocate_page;
          }
          testcase( iNewTrunk==mxPage );
          rc = btreeGetPage(pBt, iNewTrunk, &pNewTrunk, 0, 0);
          if( rc!=SQLITE_OK ){
            goto end_allocate_page;
          }
          rc = sqlite3PagerWrite(pNewTrunk->pDbPage);
          if( rc!=SQLITE_OK ){
            releasePage(pNewTrunk);
            goto end_allocate_page;
          }
          memcpy(&pNewTrunk->aData[0], &pTrunk->aData[0], 4);
          put4byte(&pNewTrunk->aData[4], k-1);
          memcpy(&pNewTrunk->aData[8], &pTrunk->aData[12], (k-1)*4);
          releasePage(pNewTrunk);
          if( !pPrevTrunk ){
            assert( sqlite3PagerIswriteable(pPage1->pDbPage) );
            put4byte(&pPage1->aData[32], iNewTrunk);
          }else{
            rc = sqlite3PagerWrite(pPrevTrunk->pDbPage);
            if( rc ){
              goto end_allocate_page;
            }
            put4byte(&pPrevTrunk->aData[0], iNewTrunk);
          }
        }
        pTrunk = 0;
        TRACE(("ALLOCATE: %d trunk - %d free pages left\n", *pPgno, n-1));
#endif
      }else if( k>0 ){
        /* Extract a leaf from the trunk */
        u32 closest;
        Pgno iPage;
        unsigned char *aData = pTrunk->aData;
        if( nearby>0 ){
          u32 i;
          closest = 0;
          if( eMode==BTALLOC_LE ){
            for(i=0; i<k; i++){
              iPage = get4byte(&aData[8+i*4]);
              if( iPage<=nearby ){
                closest = i;
                break;
              }
            }
          }else{
            int dist;
            dist = sqlite3AbsInt32(get4byte(&aData[8]) - nearby);
            for(i=1; i<k; i++){
              int d2 = sqlite3AbsInt32(get4byte(&aData[8+i*4]) - nearby);
              if( d2<dist ){
                closest = i;
                dist = d2;
              }
            }
          }
        }else{
          closest = 0;
        }

        iPage = get4byte(&aData[8+closest*4]);
        testcase( iPage==mxPage );
        if( iPage>mxPage ){
          rc = SQLITE_CORRUPT_BKPT;
          goto end_allocate_page;
        }
        testcase( iPage==mxPage );
        if( !searchList 
         || (iPage==nearby || (iPage<nearby && eMode==BTALLOC_LE)) 
        ){
          int noContent;
          *pPgno = iPage;
          TRACE(("ALLOCATE: %d was leaf %d of %d on trunk %d"
                 ": %d more free pages\n",
                 *pPgno, closest+1, k, pTrunk->pgno, n-1));
          rc = sqlite3PagerWrite(pTrunk->pDbPage);
          if( rc ) goto end_allocate_page;
          if( closest<k-1 ){
            memcpy(&aData[8+closest*4], &aData[4+k*4], 4);
          }
          put4byte(&aData[4], k-1);
          noContent = !btreeGetHasContent(pBt, *pPgno);
          rc = btreeGetPage(pBt, *pPgno, ppPage, noContent, 0);
          if( rc==SQLITE_OK ){
            rc = sqlite3PagerWrite((*ppPage)->pDbPage);
            if( rc!=SQLITE_OK ){
              releasePage(*ppPage);
            }
          }
          searchList = 0;
        }
      }
      releasePage(pPrevTrunk);
      pPrevTrunk = 0;
    }while( searchList );
  }else{
    /* There are no pages on the freelist, so append a new page to the
    ** database image.
    **
    ** Normally, new pages allocated by this block can be requested from the
    ** pager layer with the 'no-content' flag set. This prevents the pager
    ** from trying to read the pages content from disk. However, if the
    ** current transaction has already run one or more incremental-vacuum
    ** steps, then the page we are about to allocate may contain content
    ** that is required in the event of a rollback. In this case, do
    ** not set the no-content flag. This causes the pager to load and journal
    ** the current page content before overwriting it.
    **
    ** Note that the pager will not actually attempt to load or journal 
    ** content for any page that really does lie past the end of the database
    ** file on disk. So the effects of disabling the no-content optimization
    ** here are confined to those pages that lie between the end of the
    ** database image and the end of the database file.
    */
    int bNoContent = (0==IfNotOmitAV(pBt->bDoTruncate));

    rc = sqlite3PagerWrite(pBt->pPage1->pDbPage);
    if( rc ) return rc;
    pBt->nPage++;
    if( pBt->nPage==PENDING_BYTE_PAGE(pBt) ) pBt->nPage++;

#ifndef SQLITE_OMIT_AUTOVACUUM
    if( pBt->autoVacuum && PTRMAP_ISPAGE(pBt, pBt->nPage) ){
      /* If *pPgno refers to a pointer-map page, allocate two new pages
      ** at the end of the file instead of one. The first allocated page
      ** becomes a new pointer-map page, the second is used by the caller.
      */
      MemPage *pPg = 0;
      TRACE(("ALLOCATE: %d from end of file (pointer-map page)\n", pBt->nPage));
      assert( pBt->nPage!=PENDING_BYTE_PAGE(pBt) );
      rc = btreeGetPage(pBt, pBt->nPage, &pPg, bNoContent, 0);
      if( rc==SQLITE_OK ){
        rc = sqlite3PagerWrite(pPg->pDbPage);
        releasePage(pPg);
      }
      if( rc ) return rc;
      pBt->nPage++;
      if( pBt->nPage==PENDING_BYTE_PAGE(pBt) ){ pBt->nPage++; }
    }
#endif
    put4byte(28 + (u8*)pBt->pPage1->aData, pBt->nPage);
    *pPgno = pBt->nPage;

    assert( *pPgno!=PENDING_BYTE_PAGE(pBt) );
    rc = btreeGetPage(pBt, *pPgno, ppPage, bNoContent, 0);
    if( rc ) return rc;
    rc = sqlite3PagerWrite((*ppPage)->pDbPage);
    if( rc!=SQLITE_OK ){
      releasePage(*ppPage);
    }
    TRACE(("ALLOCATE: %d from end of file\n", *pPgno));
  }

  assert( *pPgno!=PENDING_BYTE_PAGE(pBt) );

end_allocate_page:
  releasePage(pTrunk);
  releasePage(pPrevTrunk);
  if( rc==SQLITE_OK ){
    if( sqlite3PagerPageRefcount((*ppPage)->pDbPage)>1 ){
      releasePage(*ppPage);
      return SQLITE_CORRUPT_BKPT;
    }
    (*ppPage)->isInit = 0;
  }else{
    *ppPage = 0;
  }
  assert( rc!=SQLITE_OK || sqlite3PagerIswriteable((*ppPage)->pDbPage) );
  return rc;
}